

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cc
# Opt level: O2

bool rcg::convertImage(uint8_t *rgb_out,uint8_t *mono_out,uint8_t *raw,uint64_t pixelformat,
                      size_t width,size_t height,size_t xpadding)

{
  byte *pbVar1;
  byte *pbVar2;
  size_t __n;
  uint8_t uVar3;
  size_t i;
  size_t sVar4;
  long lVar5;
  byte *pbVar6;
  _Head_base<0UL,_unsigned_char_*,_false> _Var7;
  size_t k;
  uint8_t *puVar8;
  ulong uVar9;
  size_t sVar10;
  size_t i_1;
  uint8_t *puVar11;
  ulong uVar12;
  _Head_base<0UL,_unsigned_char_*,_false> _Var13;
  uint8_t *p;
  bool bVar14;
  uint8_t local_bb;
  uint8_t green;
  uint8_t red;
  size_t local_b8;
  uint8_t *local_b0;
  _Head_base<0UL,_unsigned_char_*,_false> local_a8;
  byte *local_a0;
  _Head_base<0UL,_unsigned_char_*,_false> local_98;
  size_t local_90;
  uint8_t rgb [12];
  __uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> local_50;
  uint8_t *local_48;
  long local_40;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> buffer;
  
  local_90 = xpadding;
  local_b8 = width;
  if (3 < pixelformat - 0x1080008) {
    if ((pixelformat != 0x1080001) && (pixelformat != 0x10800c6)) {
      if (pixelformat == 0x20c005a) {
        for (local_b0 = (uint8_t *)0x0; local_b0 != (uint8_t *)height;
            local_b0 = (uint8_t *)((long)local_b0 + 1)) {
          for (uVar12 = 0; uVar12 < local_b8; uVar12 = uVar12 + 4) {
            if (rgb_out == (uint8_t *)0x0) {
              rgb_out = (uint8_t *)0x0;
            }
            else {
              convYCbCr411toQuadRGB(rgb,raw,(int)uVar12);
              for (lVar5 = 0; lVar5 != 0xc; lVar5 = lVar5 + 1) {
                rgb_out[lVar5] = rgb[lVar5];
              }
              rgb_out = rgb_out + 0xc;
            }
            if (mono_out == (uint8_t *)0x0) {
              mono_out = (uint8_t *)0x0;
            }
            else {
              lVar5 = (uVar12 >> 2) * 6;
              *mono_out = raw[lVar5];
              mono_out[1] = raw[lVar5 + 1];
              mono_out[2] = raw[lVar5 + 3];
              mono_out[3] = raw[lVar5 + 4];
              mono_out = mono_out + 4;
            }
          }
          raw = raw + (width >> 2) * 6 + xpadding;
        }
        return true;
      }
      if ((pixelformat == 0x2100032) || (pixelformat == 0x210003b)) {
        local_b0 = (uint8_t *)(xpadding + (width & 0xfffffffffffffffc) * 2);
        for (sVar10 = 0; sVar10 != height; sVar10 = sVar10 + 1) {
          for (uVar12 = 0; uVar12 < local_b8; uVar12 = uVar12 + 4) {
            if (rgb_out == (uint8_t *)0x0) {
              rgb_out = (uint8_t *)0x0;
            }
            else {
              convYCbCr422toQuadRGB(rgb,raw,(int)uVar12);
              for (lVar5 = 0; lVar5 != 0xc; lVar5 = lVar5 + 1) {
                rgb_out[lVar5] = rgb[lVar5];
              }
              rgb_out = rgb_out + 0xc;
            }
            if (mono_out == (uint8_t *)0x0) {
              mono_out = (uint8_t *)0x0;
            }
            else {
              *mono_out = raw[uVar12 * 2];
              mono_out[1] = raw[uVar12 * 2 + 2];
              mono_out[2] = raw[uVar12 * 2 + 4];
              mono_out[3] = raw[uVar12 * 2 + 6];
              mono_out = mono_out + 4;
            }
          }
          raw = raw + (long)local_b0;
        }
        return true;
      }
      if (pixelformat != 0x81080001) {
        if (pixelformat == 0x2180014) {
          __n = width * 3;
          local_90 = xpadding + __n;
          puVar11 = raw + 2;
          for (puVar8 = (uint8_t *)0x0; puVar8 != (uint8_t *)height;
              puVar8 = (uint8_t *)((long)puVar8 + 1)) {
            if (rgb_out == (uint8_t *)0x0) {
              rgb_out = (uint8_t *)0x0;
            }
            else {
              local_b0 = puVar8;
              memcpy(rgb_out,raw,__n);
              rgb_out = rgb_out + __n;
              puVar8 = local_b0;
            }
            sVar10 = local_b8;
            local_b0 = puVar11;
            if (mono_out == (uint8_t *)0x0) {
              mono_out = (uint8_t *)0x0;
            }
            else {
              while (sVar10 != 0) {
                uVar3 = anon_unknown_3::rgb2Grey(puVar11[-2],puVar11[-1],*puVar11);
                *mono_out = uVar3;
                mono_out = mono_out + 1;
                puVar11 = puVar11 + 3;
                sVar10 = sVar10 - 1;
              }
            }
            raw = raw + local_90;
            puVar11 = local_b0 + local_90;
          }
          return true;
        }
        return false;
      }
    }
    local_90 = xpadding + width;
    for (sVar10 = 0; sVar10 != height; sVar10 = sVar10 + 1) {
      if (rgb_out == (uint8_t *)0x0) {
        rgb_out = (uint8_t *)0x0;
      }
      else {
        for (sVar4 = 0; local_b8 != sVar4; sVar4 = sVar4 + 1) {
          uVar3 = raw[sVar4];
          *rgb_out = uVar3;
          rgb_out[1] = uVar3;
          rgb_out[2] = uVar3;
          rgb_out = rgb_out + 3;
        }
      }
      if (mono_out == (uint8_t *)0x0) {
        mono_out = (uint8_t *)0x0;
      }
      else {
        memcpy(mono_out,raw,width);
        mono_out = mono_out + width;
      }
      raw = raw + local_90;
    }
    return true;
  }
  local_b0 = (uint8_t *)CONCAT71(local_b0._1_7_,(pixelformat & 0xfffffffffffffffd) == 0x1080008);
  bVar14 = (pixelformat & 0xfffffffffffffffe) == 0x1080008;
  local_40 = width * 3;
  local_50._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)operator_new__(width * 3 + 6);
  pbVar1 = (byte *)((long)local_50._M_t.
                          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                          .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + width);
  pbVar6 = (byte *)((long)local_50._M_t.
                          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                          .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + width) + 2;
  _Var7._M_head_impl = pbVar1 + width + 4;
  pbVar2 = (byte *)((long)local_50._M_t.
                          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                          .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + width);
  buffer._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       local_50._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  memcpy(pbVar2 + 3,raw + xpadding + width,width);
  memcpy(pbVar1 + width + 5,raw,width);
  pbVar2[2] = pbVar2[4];
  pbVar1[width + 3] = pbVar1[width + 1];
  pbVar1[width + 4] = pbVar1[width + 6];
  pbVar1[width + 3 + width + 2] = pbVar1[width + 1 + width + 2];
  local_90 = local_90 + width;
  uVar12 = 0;
  do {
    sVar10 = local_b8;
    if (uVar12 == height) {
      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&buffer);
      return true;
    }
    uVar12 = uVar12 + 1;
    _Var13._M_head_impl =
         (uchar *)local_50._M_t.
                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    if (uVar12 < height) {
      memcpy((byte *)((long)local_50._M_t.
                            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                            .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 1),
             raw + uVar12 * local_90,local_b8);
      *(byte *)local_50._M_t.
               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           *(byte *)((long)local_50._M_t.
                           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                           .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 2);
      ((byte *)((long)local_50._M_t.
                      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                      .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 1))[sVar10] =
           ((byte *)((long)local_50._M_t.
                           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                           .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + -1))
           [sVar10];
      _Var13._M_head_impl = pbVar6;
      pbVar6 = _Var7._M_head_impl;
      _Var7._M_head_impl =
           (uchar *)local_50._M_t.
                    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    }
    local_a8._M_head_impl = _Var7._M_head_impl;
    local_a0 = pbVar6;
    local_98._M_head_impl = _Var13._M_head_impl;
    rgb._0_8_ = rgb_out;
    local_48 = mono_out;
    if (bVar14) {
      if (((ulong)local_b0 & 1) == 0) {
        uVar9 = 0;
      }
      else {
        red = (uint8_t)((uint)*pbVar6 + (uint)pbVar6[2] + 1 >> 1);
        local_a0 = pbVar6 + 1;
        green = pbVar6[1];
        local_98._M_head_impl = _Var13._M_head_impl + 1;
        local_a8._M_head_impl = _Var7._M_head_impl + 1;
        local_bb = (uint8_t)((uint)_Var7._M_head_impl[1] + (uint)_Var13._M_head_impl[1] + 1 >> 1);
        anon_unknown_3::storeRGBMono((uint8_t **)rgb,&local_48,red,green,local_bb);
        uVar9 = 1;
      }
      for (; uVar9 + 1 < local_b8; uVar9 = uVar9 + 2) {
        anon_unknown_3::convertRed
                  (&red,&green,&local_bb,&local_98._M_head_impl,&local_a0,&local_a8._M_head_impl);
        anon_unknown_3::storeRGBMono((uint8_t **)rgb,&local_48,red,green,local_bb);
        red = (uint8_t)((uint)local_a0[2] + (uint)*local_a0 + 1 >> 1);
        green = local_a0[1];
        local_a0 = local_a0 + 1;
        pbVar1 = local_98._M_head_impl + 1;
        local_98._M_head_impl = local_98._M_head_impl + 1;
        pbVar2 = local_a8._M_head_impl + 1;
        local_a8._M_head_impl = local_a8._M_head_impl + 1;
        local_bb = (uint8_t)((uint)*pbVar2 + (uint)*pbVar1 + 1 >> 1);
        anon_unknown_3::storeRGBMono((uint8_t **)rgb,&local_48,red,green,local_bb);
      }
      if (uVar9 < local_b8) {
        anon_unknown_3::convertRed
                  (&red,&green,&local_bb,&local_98._M_head_impl,&local_a0,&local_a8._M_head_impl);
LAB_0011d1a0:
        anon_unknown_3::storeRGBMono((uint8_t **)rgb,&local_48,red,green,local_bb);
      }
    }
    else {
      if (((ulong)local_b0 & 1) == 0) {
        uVar9 = 0;
      }
      else {
        local_98._M_head_impl = _Var13._M_head_impl + 1;
        local_a8._M_head_impl = _Var7._M_head_impl + 1;
        red = (uint8_t)((uint)_Var7._M_head_impl[1] + (uint)_Var13._M_head_impl[1] + 1 >> 1);
        local_a0 = pbVar6 + 1;
        green = pbVar6[1];
        local_bb = (uint8_t)((uint)*pbVar6 + (uint)pbVar6[2] + 1 >> 1);
        anon_unknown_3::storeRGBMono((uint8_t **)rgb,&local_48,red,green,local_bb);
        uVar9 = 1;
      }
      for (; uVar9 + 1 < local_b8; uVar9 = uVar9 + 2) {
        anon_unknown_3::convertBlue
                  (&red,&green,&local_bb,&local_98._M_head_impl,&local_a0,&local_a8._M_head_impl);
        anon_unknown_3::storeRGBMono((uint8_t **)rgb,&local_48,red,green,local_bb);
        pbVar1 = local_98._M_head_impl + 1;
        local_98._M_head_impl = local_98._M_head_impl + 1;
        pbVar2 = local_a8._M_head_impl + 1;
        local_a8._M_head_impl = local_a8._M_head_impl + 1;
        red = (uint8_t)((uint)*pbVar2 + (uint)*pbVar1 + 1 >> 1);
        green = local_a0[1];
        local_bb = (uint8_t)((uint)*local_a0 + (uint)local_a0[2] + 1 >> 1);
        local_a0 = local_a0 + 1;
        anon_unknown_3::storeRGBMono((uint8_t **)rgb,&local_48,red,green,local_bb);
      }
      if (uVar9 < local_b8) {
        anon_unknown_3::convertBlue
                  (&red,&green,&local_bb,&local_98._M_head_impl,&local_a0,&local_a8._M_head_impl);
        goto LAB_0011d1a0;
      }
    }
    if (rgb_out != (uint8_t *)0x0) {
      rgb_out = rgb_out + local_40;
    }
    if (mono_out != (uint8_t *)0x0) {
      mono_out = mono_out + local_b8;
    }
    local_b0 = (uint8_t *)((ulong)local_b0 ^ 1);
    bVar14 = (bool)(bVar14 ^ 1);
    local_50._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
         (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)_Var13._M_head_impl;
  } while( true );
}

Assistant:

bool convertImage(uint8_t *rgb_out, uint8_t *mono_out, const uint8_t *raw, uint64_t pixelformat,
  size_t width, size_t height, size_t xpadding)
{
  bool ret=true;

  switch (pixelformat)
  {
    case Mono8:
    case Confidence8:
    case Error8:
      {
        for (size_t k=0; k<height; k++)
        {
          if (rgb_out)
          {
            for (size_t i=0; i<width; i++)
            {
              uint8_t v=raw[i];
              *rgb_out++ = v;
              *rgb_out++ = v;
              *rgb_out++ = v;
            }
          }

          if (mono_out)
          {
            std::memcpy(mono_out, raw, width*sizeof(uint8_t));
            mono_out+=width;
          }

          raw+=width+xpadding;
        }
      }
      break;

    case YCbCr411_8:
      {
        size_t pstep=(width>>2)*6+xpadding;
        for (size_t k=0; k<height; k++)
        {
          for (size_t i=0; i<width; i+=4)
          {
            if (rgb_out)
            {
              uint8_t rgb[12];
              convYCbCr411toQuadRGB(rgb, raw, static_cast<int>(i));

              for (int j=0; j<12; j++)
              {
                *rgb_out++ = rgb[j];
              }
            }

            if (mono_out)
            {
              size_t j=(i>>2)*6;
              *mono_out++ = raw[j];
              *mono_out++ = raw[j+1];
              *mono_out++ = raw[j+3];
              *mono_out++ = raw[j+4];
            }
          }

          raw+=pstep;
        }
      }
      break;

    case YCbCr422_8:
    case YUV422_8:
      {
        size_t pstep=(width>>2)*8+xpadding;
        for (size_t k=0; k<height; k++)
        {
          for (size_t i=0; i<width; i+=4)
          {
            if (rgb_out)
            {
              uint8_t rgb[12];
              convYCbCr422toQuadRGB(rgb, raw, static_cast<int>(i));

              for (int j=0; j<12; j++)
              {
                *rgb_out++ = rgb[j];
              }
            }

            if (mono_out)
            {
              size_t j=(i>>2)*8;
              *mono_out++ = raw[j];
              *mono_out++ = raw[j+2];
              *mono_out++ = raw[j+4];
              *mono_out++ = raw[j+6];
            }
          }

          raw+=pstep;
        }
      }
      break;

    case RGB8:
      {
        for (size_t k=0; k<height; k++)
        {
          if (rgb_out)
          {
            std::memcpy(rgb_out, raw, 3*width*sizeof(uint8_t));
            rgb_out+=3*width;
          }

          if (mono_out)
          {
            size_t j=0;
            for (size_t i=0; i<width; i++)
            {
              *mono_out++ = rgb2Grey(raw[j], raw[j+1], raw[j+2]);
              j+=3;
            }
          }

          raw+=3*width+xpadding;
        }
      }
      break;

    case BayerRG8:
    case BayerBG8:
    case BayerGR8:
    case BayerGB8:
      {
        // In every row, every second pixel is green and every other pixel is
        // either red or blue. This flag specifies if the current row is red or
        // blue.

        bool greenfirst=(pixelformat == BayerGR8 || pixelformat == BayerGB8);
        bool red=(pixelformat == BayerRG8 || pixelformat == BayerGR8);

        // setup temporary buffer that is 1 pixel larger than the image

        std::unique_ptr<uint8_t []> buffer(new uint8_t [(width+2)*3]);
        uint8_t *row[3];

        row[0]=buffer.get();
        row[1]=row[0]+width+2;
        row[2]=row[1]+width+2;

        // initialize buffer with 2 rows, extended by two pixel to avoid a special
        // treatment for the image border

        memcpy(row[1]+1, raw+width+xpadding, width*sizeof(uint8_t));
        memcpy(row[2]+1, raw, width*sizeof(uint8_t));

        row[1][0]=row[1][2]; row[1][width+1]=row[1][width-1];
        row[2][0]=row[2][2]; row[2][width+1]=row[2][width-1];

        // for all rows

        for (size_t k=0; k<height; k++)
        {
          // store next extended row in buffer

          if (k+1 < height)
          {
            uint8_t *p=row[0];
            row[0]=row[1];
            row[1]=row[2];
            row[2]=p;

            memcpy(row[2]+1, raw+(k+1)*(width+xpadding), width*sizeof(uint8_t));

            row[2][0]=row[2][2]; row[2][width+1]=row[2][width-1];
          }

          if (red)
          {
            convertBayerGR(rgb_out, mono_out, row[0], row[1], row[2], greenfirst, width);

            if (rgb_out) rgb_out+=3*width;
            if (mono_out) mono_out+=width;
          }
          else
          {
            convertBayerGB(rgb_out, mono_out, row[0], row[1], row[2], greenfirst, width);

            if (rgb_out) rgb_out+=3*width;
            if (mono_out) mono_out+=width;
          }

          greenfirst=!greenfirst;
          red=!red;
        }
      }
      break;

    default:
      ret=false;
      break;
  }

  return ret;
}